

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O0

JavascriptPromiseReaction *
TTD::NSSnapValues::InflatePromiseReactionInfo
          (SnapPromiseReactionInfo *reactionInfo,ScriptContext *ctx,InflateMap *inflator)

{
  bool bVar1;
  RecyclableObject *handler_00;
  JavascriptPromiseCapability *capabilities_00;
  JavascriptLibrary *this;
  JavascriptPromiseReaction *pJVar2;
  JavascriptPromiseReaction *res;
  JavascriptPromiseCapability *capabilities;
  RecyclableObject *handler;
  InflateMap *inflator_local;
  ScriptContext *ctx_local;
  SnapPromiseReactionInfo *reactionInfo_local;
  
  bVar1 = InflateMap::IsPromiseInfoDefined<Js::JavascriptPromiseReaction>
                    (inflator,reactionInfo->PromiseReactionId);
  if (!bVar1) {
    handler_00 = InflateMap::LookupObject(inflator,reactionInfo->HandlerObjId);
    capabilities_00 = InflatePromiseCapabilityInfo(&reactionInfo->Capabilities,ctx,inflator);
    this = Js::ScriptContext::GetLibrary(ctx);
    pJVar2 = Js::JavascriptLibrary::CreatePromiseReaction_TTD(this,handler_00,capabilities_00);
    InflateMap::AddInflatedPromiseInfo<Js::JavascriptPromiseReaction>
              (inflator,reactionInfo->PromiseReactionId,pJVar2);
  }
  pJVar2 = InflateMap::LookupInflatedPromiseInfo<Js::JavascriptPromiseReaction>
                     (inflator,reactionInfo->PromiseReactionId);
  return pJVar2;
}

Assistant:

Js::JavascriptPromiseReaction* InflatePromiseReactionInfo(const SnapPromiseReactionInfo* reactionInfo, Js::ScriptContext* ctx, InflateMap* inflator)
        {
            if(!inflator->IsPromiseInfoDefined<Js::JavascriptPromiseReaction>(reactionInfo->PromiseReactionId))
            {
                Js::RecyclableObject* handler = inflator->LookupObject(reactionInfo->HandlerObjId);
                Js::JavascriptPromiseCapability* capabilities = InflatePromiseCapabilityInfo(&reactionInfo->Capabilities, ctx, inflator);

                Js::JavascriptPromiseReaction* res = ctx->GetLibrary()->CreatePromiseReaction_TTD(handler, capabilities);
                inflator->AddInflatedPromiseInfo<Js::JavascriptPromiseReaction>(reactionInfo->PromiseReactionId, res);
            }

            return inflator->LookupInflatedPromiseInfo<Js::JavascriptPromiseReaction>(reactionInfo->PromiseReactionId);
        }